

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__seek_to_pcm_frame__brute_force(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  bool bVar1;
  ma_bool32 mVar2;
  ma_result mVar3;
  ulong uVar4;
  ma_dr_flac *pFlac_00;
  ulong in_RSI;
  ma_dr_flac *in_RDI;
  ma_result result_1;
  ma_result result;
  ma_uint64 pcmFramesToDecode;
  ma_uint64 lastPCMFrameInFLACFrame;
  ma_uint64 firstPCMFrameInFLACFrame;
  ma_uint64 pcmFrameCountInThisFLACFrame;
  ma_uint64 runningPCMFrameCount;
  ma_bool32 isMidFrame;
  ma_dr_flac_frame_header *in_stack_000000d0;
  ma_uint8 in_stack_000000df;
  ma_dr_flac_bs *in_stack_000000e0;
  ma_result in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ma_dr_flac *in_stack_ffffffffffffffb0;
  ma_uint64 local_48;
  ma_dr_flac *pmVar5;
  ma_uint64 local_30;
  
  bVar1 = false;
  if (in_RSI < in_RDI->currentPCMFrame) {
    local_30 = 0;
    mVar2 = ma_dr_flac__seek_to_first_frame(in_stack_ffffffffffffffb0);
    if (mVar2 == 0) {
      return 0;
    }
    mVar2 = ma_dr_flac__read_next_flac_frame_header
                      (in_stack_000000e0,in_stack_000000df,in_stack_000000d0);
    if (mVar2 == 0) {
      return 0;
    }
  }
  else {
    local_30 = in_RDI->currentPCMFrame;
    if ((in_RDI->currentPCMFrame == 0) && ((in_RDI->currentFLACFrame).pcmFramesRemaining == 0)) {
      mVar2 = ma_dr_flac__read_next_flac_frame_header
                        (in_stack_000000e0,in_stack_000000df,in_stack_000000d0);
      if (mVar2 == 0) {
        return 0;
      }
    }
    else {
      bVar1 = true;
    }
  }
  do {
    pmVar5 = (ma_dr_flac *)0x0;
    local_48 = 0;
    ma_dr_flac__get_pcm_frame_range_of_current_flac_frame
              (in_RDI,(ma_uint64 *)&stack0xffffffffffffffc0,&local_48);
    uVar4 = (local_48 - (long)pmVar5) + 1;
    if (in_RSI < local_30 + uVar4) {
      pFlac_00 = (ma_dr_flac *)(in_RSI - local_30);
      if (bVar1) {
        pmVar5 = (ma_dr_flac *)
                 ma_dr_flac__seek_forward_by_pcm_frames
                           (pFlac_00,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        return (uint)(pmVar5 == pFlac_00);
      }
      mVar3 = ma_dr_flac__decode_flac_frame(pmVar5);
      if (mVar3 == MA_SUCCESS) {
        pmVar5 = (ma_dr_flac *)
                 ma_dr_flac__seek_forward_by_pcm_frames
                           (pFlac_00,(ulong)(uint)in_stack_ffffffffffffffa8);
        return (uint)(pmVar5 == pFlac_00);
      }
      if (mVar3 != MA_CRC_MISMATCH) {
        return 0;
      }
      in_stack_ffffffffffffffac = 0xffffff9c;
    }
    else {
      if (bVar1) {
        uVar4 = (ulong)(in_RDI->currentFLACFrame).pcmFramesRemaining;
        (in_RDI->currentFLACFrame).pcmFramesRemaining = 0;
        bVar1 = false;
      }
      else {
        in_stack_ffffffffffffffa8 = ma_dr_flac__seek_flac_frame(pmVar5);
        if (in_stack_ffffffffffffffa8 != MA_SUCCESS) {
          if (in_stack_ffffffffffffffa8 != MA_CRC_MISMATCH) {
            return 0;
          }
          goto LAB_00200106;
        }
      }
      local_30 = uVar4 + local_30;
      if ((in_RSI == in_RDI->totalPCMFrameCount) && (local_30 == in_RDI->totalPCMFrameCount)) {
        return 1;
      }
    }
LAB_00200106:
    mVar2 = ma_dr_flac__read_next_flac_frame_header
                      (in_stack_000000e0,in_stack_000000df,in_stack_000000d0);
    if (mVar2 == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__brute_force(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_bool32 isMidFrame = MA_FALSE;
    ma_uint64 runningPCMFrameCount;
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    if (pcmFrameIndex >= pFlac->currentPCMFrame) {
        runningPCMFrameCount = pFlac->currentPCMFrame;
        if (pFlac->currentPCMFrame == 0 && pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                return MA_FALSE;
            }
        } else {
            isMidFrame = MA_TRUE;
        }
    } else {
        runningPCMFrameCount = 0;
        if (!ma_dr_flac__seek_to_first_frame(pFlac)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
    for (;;) {
        ma_uint64 pcmFrameCountInThisFLACFrame;
        ma_uint64 firstPCMFrameInFLACFrame = 0;
        ma_uint64 lastPCMFrameInFLACFrame = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &firstPCMFrameInFLACFrame, &lastPCMFrameInFLACFrame);
        pcmFrameCountInThisFLACFrame = (lastPCMFrameInFLACFrame - firstPCMFrameInFLACFrame) + 1;
        if (pcmFrameIndex < (runningPCMFrameCount + pcmFrameCountInThisFLACFrame)) {
            ma_uint64 pcmFramesToDecode = pcmFrameIndex - runningPCMFrameCount;
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
            }
        } else {
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__seek_to_next_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    runningPCMFrameCount += pcmFrameCountInThisFLACFrame;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                runningPCMFrameCount += pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
                isMidFrame = MA_FALSE;
            }
            if (pcmFrameIndex == pFlac->totalPCMFrameCount && runningPCMFrameCount == pFlac->totalPCMFrameCount) {
                return MA_TRUE;
            }
        }
    next_iteration:
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
}